

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_CopyTwiceAllocatedStringFieldTest_Test::
TestBody(NoFieldPresenceTest_CopyTwiceAllocatedStringFieldTest_Test *this)

{
  TestAllTypes src;
  TestAllTypes dst;
  TestAllTypes TStack_568;
  TestAllTypes local_2b8;
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes(&TStack_568);
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes(&local_2b8);
  proto2_nofieldpresence_unittest::TestAllTypes::_internal_mutable_optional_string_abi_cxx11_
            (&TStack_568);
  proto2_nofieldpresence_unittest::TestAllTypes::CopyFrom(&local_2b8,&TStack_568);
  proto2_nofieldpresence_unittest::TestAllTypes::CopyFrom(&local_2b8,&TStack_568);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes(&local_2b8);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes(&TStack_568);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, CopyTwiceAllocatedStringFieldTest) {
  // As an optimization, we maintain a default string in memory and messages
  // with uninitialized fields will be constructed with a pointer to this
  // default string object. The destructor should clear the field only when it
  // is "set" to a nondefault object.
  TestAllTypes src, dst;

  src.mutable_optional_string();  // this causes a memory allocation.

  dst = src;
  dst = src;
}